

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O1

Float pbrt::CatmullRom(span<const_float> nodes,span<const_float> f,Float x)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  float *pfVar10;
  float *pfVar11;
  ulong uVar12;
  int iVar13;
  Float FVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  size_t vb;
  size_t va;
  
  vb = f.n;
  pfVar10 = f.ptr;
  va = nodes.n;
  pfVar11 = nodes.ptr;
  if (va != vb) {
    LogFatal<char_const(&)[13],char_const(&)[9],char_const(&)[13],unsigned_long&,char_const(&)[9],unsigned_long&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/math.cpp"
               ,0xcc,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [13])"nodes.size()",
               (char (*) [9])0x3fe5fc,(char (*) [13])"nodes.size()",&va,(char (*) [9])0x3fe5fc,&vb);
  }
  if ((x < *pfVar11) || (pfVar11[va - 1] < x)) {
    FVar14 = 0.0;
  }
  else {
    uVar8 = va - 2;
    lVar9 = 1;
    uVar12 = uVar8;
    while (uVar7 = uVar12, 0 < (long)uVar7) {
      uVar12 = uVar7 >> 1;
      if (pfVar11[(int)uVar12 + (int)lVar9] <= x) {
        lVar9 = uVar12 + 1 + lVar9;
        uVar12 = ~uVar12 + uVar7;
      }
    }
    if (lVar9 - 1U < uVar8) {
      uVar8 = lVar9 - 1U;
    }
    uVar12 = 0;
    if (0 < lVar9) {
      uVar12 = uVar8;
    }
    iVar13 = (int)uVar12;
    fVar1 = pfVar11[iVar13];
    lVar9 = (long)((uVar12 << 0x20) + 0x100000000) >> 0x1e;
    fVar16 = *(float *)((long)pfVar11 + lVar9);
    fVar2 = pfVar10[iVar13];
    fVar3 = *(float *)((long)pfVar10 + lVar9);
    fVar15 = fVar16 - fVar1;
    if (iVar13 < 1) {
      fVar16 = fVar3 - fVar2;
    }
    else {
      fVar16 = (fVar15 * (fVar3 - pfVar10[iVar13 - 1U])) / (fVar16 - pfVar11[iVar13 - 1U]);
    }
    uVar8 = (long)((uVar12 << 0x20) + 0x200000000) >> 0x20;
    if (uVar8 < va) {
      auVar17._0_4_ = (fVar15 * (pfVar10[uVar8] - fVar2)) / (pfVar11[uVar8] - fVar1);
      auVar17._4_12_ = SUB6012((undefined1  [60])0x0,0);
    }
    else {
      auVar17 = ZEXT416((uint)(fVar3 - fVar2));
    }
    fVar15 = (x - fVar1) / fVar15;
    fVar1 = fVar15 * fVar15;
    fVar4 = fVar15 * fVar1;
    auVar6 = vfmsub213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)fVar4),
                             ZEXT416((uint)(fVar1 * 3.0)));
    auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * 3.0)),ZEXT416((uint)fVar4),
                             SUB6416(ZEXT464(0xc0000000),0));
    auVar5 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)(auVar6._0_4_ + 1.0)),
                             ZEXT416((uint)(fVar3 * auVar5._0_4_)));
    auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar1),
                             ZEXT416((uint)fVar4));
    auVar5 = vfmadd213ss_fma(ZEXT416((uint)fVar16),ZEXT416((uint)(auVar6._0_4_ + fVar15)),auVar5);
    auVar17 = vfmadd213ss_fma(ZEXT416((uint)(fVar4 - fVar1)),auVar17,auVar5);
    FVar14 = auVar17._0_4_;
  }
  return FVar14;
}

Assistant:

Float CatmullRom(pstd::span<const Float> nodes, pstd::span<const Float> f, Float x) {
    CHECK_EQ(nodes.size(), f.size());
    if (!(x >= nodes.front() && x <= nodes.back()))
        return 0;
    int idx = FindInterval(nodes.size(), [&](int i) { return nodes[i] <= x; });
    Float x0 = nodes[idx], x1 = nodes[idx + 1];
    Float f0 = f[idx], f1 = f[idx + 1];
    Float width = x1 - x0;
    Float d0, d1;
    if (idx > 0)
        d0 = width * (f1 - f[idx - 1]) / (x1 - nodes[idx - 1]);
    else
        d0 = f1 - f0;

    if (idx + 2 < nodes.size())
        d1 = width * (f[idx + 2] - f0) / (nodes[idx + 2] - x0);
    else
        d1 = f1 - f0;

    Float t = (x - x0) / (x1 - x0), t2 = t * t, t3 = t2 * t;
    return (2 * t3 - 3 * t2 + 1) * f0 + (-2 * t3 + 3 * t2) * f1 + (t3 - 2 * t2 + t) * d0 +
           (t3 - t2) * d1;
}